

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *c,_Bool httpheader,char *lineptr,char *domain,
                        char *path)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  time_t tVar5;
  bool bVar6;
  bool bVar7;
  byte local_511;
  char *local_510;
  char *local_500;
  int local_4ec;
  char *pcStack_4e8;
  int fields;
  char *tok_buf;
  char *firstptr;
  char *ptr_1;
  size_t pathlen;
  char *endslash;
  char *queryp;
  char *dotp;
  char *pcStack_4a8;
  _Bool is_ip;
  char *endofn;
  size_t nlen;
  size_t len;
  _Bool sep;
  char *pcStack_488;
  _Bool done;
  char *whatptr;
  char *what;
  char *semiptr;
  char *ptr;
  _Bool badcookie;
  time_t tStack_460;
  _Bool replace_old;
  time_t now;
  Cookie *lastc;
  Cookie *co;
  char name [1024];
  Cookie *clist;
  char *path_local;
  char *domain_local;
  char *lineptr_local;
  _Bool httpheader_local;
  CookieInfo *c_local;
  Curl_easy *data_local;
  
  now = 0;
  tStack_460 = time((time_t *)0x0);
  ptr._7_1_ = 0;
  ptr._6_1_ = 0;
  lastc = (Cookie *)(*Curl_ccalloc)(1,0x60);
  if (lastc == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  domain_local = lineptr;
  if (httpheader) {
    whatptr = (char *)(*Curl_cmalloc)(5000);
    if (whatptr == (char *)0x0) {
      (*Curl_cfree)(lastc);
      return (Cookie *)0x0;
    }
    what = strchr(lineptr,0x3b);
    while( true ) {
      bVar6 = false;
      if ((*domain_local != '\0') && (bVar6 = true, *domain_local != ' ')) {
        bVar6 = *domain_local == '\t';
      }
      if (!bVar6) break;
      domain_local = domain_local + 1;
    }
    semiptr = domain_local;
    path_local = domain;
    do {
      *whatptr = '\0';
      co._0_1_ = 0;
      iVar2 = __isoc99_sscanf(semiptr,"%1023[^;\r\n=] =%4999[^;\r\n]",&co,whatptr);
      if (0 < iVar2) {
        len._7_1_ = 0;
        nlen = strlen(whatptr);
        endofn = (char *)strlen((char *)&co);
        pcStack_4a8 = semiptr + (long)endofn;
        len._6_1_ = *pcStack_4a8 == '=';
        if (endofn != (char *)0x0) {
          pcStack_4a8 = pcStack_4a8 + -1;
          bVar6 = true;
          if (*pcStack_4a8 != ' ') {
            bVar6 = *pcStack_4a8 == '\t';
          }
          if (bVar6) {
            while( true ) {
              bVar6 = false;
              if (*pcStack_4a8 != '\0') {
                bVar7 = true;
                if (*pcStack_4a8 != ' ') {
                  bVar7 = *pcStack_4a8 == '\t';
                }
                bVar6 = false;
                if (bVar7) {
                  bVar6 = endofn != (char *)0x0;
                }
              }
              if (!bVar6) break;
              pcStack_4a8 = pcStack_4a8 + -1;
              endofn = endofn + -1;
            }
            *(char *)((long)&co + (long)endofn) = '\0';
          }
        }
        while( true ) {
          bVar6 = false;
          if ((nlen != 0) && (bVar6 = true, whatptr[nlen - 1] != ' ')) {
            bVar6 = whatptr[nlen - 1] == '\t';
          }
          if (!bVar6) break;
          whatptr[nlen - 1] = '\0';
          nlen = nlen - 1;
        }
        pcStack_488 = whatptr;
        while( true ) {
          bVar6 = false;
          if ((*pcStack_488 != '\0') && (bVar6 = true, *pcStack_488 != ' ')) {
            bVar6 = *pcStack_488 == '\t';
          }
          if (!bVar6) break;
          pcStack_488 = pcStack_488 + 1;
        }
        if ((lastc->name == (char *)0x0) && ((bool)len._6_1_)) {
          pcVar3 = (*Curl_cstrdup)((char *)&co);
          lastc->name = pcVar3;
          pcVar3 = (*Curl_cstrdup)(pcStack_488);
          lastc->value = pcVar3;
          if ((lastc->name == (char *)0x0) || (lastc->value == (char *)0x0)) {
            ptr._6_1_ = 1;
            break;
          }
        }
        else if (nlen == 0) {
          len._7_1_ = 1;
          iVar2 = Curl_strcasecompare("secure",(char *)&co);
          if (iVar2 == 0) {
            iVar2 = Curl_strcasecompare("httponly",(char *)&co);
            if (iVar2 == 0) {
              if ((len._6_1_ & 1) != 0) {
                len._7_1_ = 0;
              }
            }
            else {
              lastc->httponly = true;
            }
          }
          else {
            lastc->secure = true;
          }
        }
        if ((len._7_1_ & 1) == 0) {
          iVar2 = Curl_strcasecompare("path",(char *)&co);
          if (iVar2 == 0) {
            iVar2 = Curl_strcasecompare("domain",(char *)&co);
            if (iVar2 == 0) {
              iVar2 = Curl_strcasecompare("version",(char *)&co);
              if (iVar2 == 0) {
                iVar2 = Curl_strcasecompare("max-age",(char *)&co);
                if (iVar2 == 0) {
                  iVar2 = Curl_strcasecompare("expires",(char *)&co);
                  if ((iVar2 != 0) &&
                     (strstore(&lastc->expirestr,pcStack_488), lastc->expirestr == (char *)0x0)) {
                    ptr._6_1_ = 1;
                    break;
                  }
                }
                else {
                  strstore(&lastc->maxage,pcStack_488);
                  if (lastc->maxage == (char *)0x0) {
                    ptr._6_1_ = 1;
                    break;
                  }
                }
              }
              else {
                strstore(&lastc->version,pcStack_488);
                if (lastc->version == (char *)0x0) {
                  ptr._6_1_ = 1;
                  break;
                }
              }
            }
            else {
              if (*pcStack_488 == '.') {
                pcStack_488 = pcStack_488 + 1;
              }
              queryp = strchr(pcStack_488,0x2e);
              if ((queryp == (char *)0x0) &&
                 (iVar2 = Curl_strcasecompare("localhost",pcStack_488), iVar2 == 0)) {
                path_local = ":";
              }
              if (path_local == (char *)0x0) {
                local_500 = pcStack_488;
              }
              else {
                local_500 = path_local;
              }
              dotp._7_1_ = isip(local_500);
              if (((path_local == (char *)0x0) ||
                  (((bool)dotp._7_1_ && (iVar2 = strcmp(pcStack_488,path_local), iVar2 == 0)))) ||
                 (((dotp._7_1_ & 1) == 0 && (_Var1 = tailmatch(pcStack_488,path_local), _Var1)))) {
                strstore(&lastc->domain,pcStack_488);
                if (lastc->domain == (char *)0x0) {
                  ptr._6_1_ = 1;
                  break;
                }
                if ((dotp._7_1_ & 1) == 0) {
                  lastc->tailmatch = true;
                }
              }
              else {
                ptr._6_1_ = 1;
                Curl_infof(data,"skipped cookie with bad tailmatch domain: %s\n",pcStack_488);
              }
            }
          }
          else {
            strstore(&lastc->path,pcStack_488);
            if (lastc->path == (char *)0x0) {
              ptr._6_1_ = 1;
              break;
            }
            pcVar3 = sanitize_cookie_path(lastc->path);
            lastc->spath = pcVar3;
            if (lastc->spath == (char *)0x0) {
              ptr._6_1_ = 1;
              break;
            }
          }
        }
      }
      if ((what == (char *)0x0) || (pcVar3 = what, *what == '\0')) {
        what = (char *)0x0;
      }
      else {
        do {
          semiptr = pcVar3 + 1;
          bVar6 = false;
          if ((*semiptr != '\0') && (bVar6 = true, *semiptr != ' ')) {
            bVar6 = *semiptr == '\t';
          }
          pcVar3 = semiptr;
        } while (bVar6);
        what = strchr(semiptr,0x3b);
        if ((what == (char *)0x0) && (*semiptr != '\0')) {
          what = strchr(semiptr,0);
        }
      }
    } while (what != (char *)0x0);
    if (lastc->maxage == (char *)0x0) {
      if (lastc->expirestr != (char *)0x0) {
        tVar5 = curl_getdate(lastc->expirestr,(time_t *)0x0);
        lastc->expires = tVar5;
        if (lastc->expires == 0) {
          lastc->expires = 1;
        }
        else if (lastc->expires < 0) {
          lastc->expires = 0;
        }
      }
    }
    else {
      if (*lastc->maxage == '\"') {
        local_510 = lastc->maxage + 1;
      }
      else {
        local_510 = lastc->maxage;
      }
      lVar4 = strtol(local_510,(char **)0x0,10);
      lastc->expires = lVar4;
      if (0x7fffffffffffffff - tStack_460 < lastc->expires) {
        lastc->expires = 0x7fffffffffffffff;
      }
      else {
        lastc->expires = tStack_460 + lastc->expires;
      }
    }
    if ((((ptr._6_1_ & 1) == 0) && (lastc->domain == (char *)0x0)) && (path_local != (char *)0x0)) {
      pcVar3 = (*Curl_cstrdup)(path_local);
      lastc->domain = pcVar3;
      if (lastc->domain == (char *)0x0) {
        ptr._6_1_ = 1;
      }
    }
    if ((((ptr._6_1_ & 1) == 0) && (lastc->path == (char *)0x0)) && (path != (char *)0x0)) {
      endslash = strchr(path,0x3f);
      if (endslash == (char *)0x0) {
        pathlen = (size_t)strrchr(path,0x2f);
      }
      else {
        pathlen = (size_t)Curl_memrchr(path,0x2f,(long)endslash - (long)path);
      }
      if (pathlen != 0) {
        ptr_1 = (char *)((pathlen - (long)path) + 1);
        pcVar3 = (char *)(*Curl_cmalloc)((pathlen - (long)path) + 2);
        lastc->path = pcVar3;
        if (lastc->path == (char *)0x0) {
          ptr._6_1_ = 1;
        }
        else {
          memcpy(lastc->path,path,(size_t)ptr_1);
          lastc->path[(long)ptr_1] = '\0';
          pcVar3 = sanitize_cookie_path(lastc->path);
          lastc->spath = pcVar3;
          if (lastc->spath == (char *)0x0) {
            ptr._6_1_ = 1;
          }
        }
      }
    }
    (*Curl_cfree)(whatptr);
    if (((ptr._6_1_ & 1) != 0) || (lastc->name == (char *)0x0)) {
      freecookie(lastc);
      return (Cookie *)0x0;
    }
  }
  else {
    pcStack_4e8 = (char *)0x0;
    iVar2 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar2 == 0) {
      domain_local = lineptr + 10;
      lastc->httponly = true;
    }
    if (*domain_local == '#') {
      (*Curl_cfree)(lastc);
      return (Cookie *)0x0;
    }
    firstptr = strchr(domain_local,0xd);
    if (firstptr != (char *)0x0) {
      *firstptr = '\0';
    }
    firstptr = strchr(domain_local,10);
    if (firstptr != (char *)0x0) {
      *firstptr = '\0';
    }
    tok_buf = strtok_r(domain_local,"\t",&stack0xfffffffffffffb18);
    local_4ec = 0;
    firstptr = tok_buf;
    while( true ) {
      local_511 = 0;
      if (firstptr != (char *)0x0) {
        local_511 = ptr._6_1_ ^ 0xff;
      }
      if ((local_511 & 1) == 0) break;
      switch(local_4ec) {
      case 0:
        if (*firstptr == '.') {
          firstptr = firstptr + 1;
        }
        pcVar3 = (*Curl_cstrdup)(firstptr);
        lastc->domain = pcVar3;
        if (lastc->domain == (char *)0x0) {
          ptr._6_1_ = 1;
        }
        break;
      case 1:
        iVar2 = Curl_strcasecompare(firstptr,"TRUE");
        lastc->tailmatch = iVar2 != 0;
        break;
      case 2:
        iVar2 = strcmp("TRUE",firstptr);
        if ((iVar2 == 0) || (iVar2 = strcmp("FALSE",firstptr), iVar2 == 0)) {
          pcVar3 = (*Curl_cstrdup)("/");
          lastc->path = pcVar3;
          if (lastc->path == (char *)0x0) {
            ptr._6_1_ = 1;
          }
          pcVar3 = (*Curl_cstrdup)("/");
          lastc->spath = pcVar3;
          if (lastc->spath == (char *)0x0) {
            ptr._6_1_ = 1;
          }
          local_4ec = local_4ec + 1;
          goto switchD_00970d4b_caseD_3;
        }
        pcVar3 = (*Curl_cstrdup)(firstptr);
        lastc->path = pcVar3;
        if (lastc->path == (char *)0x0) {
          ptr._6_1_ = 1;
        }
        else {
          pcVar3 = sanitize_cookie_path(lastc->path);
          lastc->spath = pcVar3;
          if (lastc->spath == (char *)0x0) {
            ptr._6_1_ = 1;
          }
        }
        break;
      case 3:
switchD_00970d4b_caseD_3:
        iVar2 = Curl_strcasecompare(firstptr,"TRUE");
        lastc->secure = iVar2 != 0;
        break;
      case 4:
        lVar4 = strtol(firstptr,(char **)0x0,10);
        lastc->expires = lVar4;
        break;
      case 5:
        pcVar3 = (*Curl_cstrdup)(firstptr);
        lastc->name = pcVar3;
        if (lastc->name == (char *)0x0) {
          ptr._6_1_ = 1;
        }
        break;
      case 6:
        pcVar3 = (*Curl_cstrdup)(firstptr);
        lastc->value = pcVar3;
        if (lastc->value == (char *)0x0) {
          ptr._6_1_ = 1;
        }
      }
      firstptr = strtok_r((char *)0x0,"\t",&stack0xfffffffffffffb18);
      local_4ec = local_4ec + 1;
    }
    if (local_4ec == 6) {
      pcVar3 = (*Curl_cstrdup)("");
      lastc->value = pcVar3;
      if (lastc->value == (char *)0x0) {
        ptr._6_1_ = 1;
      }
      else {
        local_4ec = 7;
      }
    }
    if (((ptr._6_1_ & 1) == 0) && (local_4ec != 7)) {
      ptr._6_1_ = 1;
    }
    if ((ptr._6_1_ & 1) != 0) {
      freecookie(lastc);
      return (Cookie *)0x0;
    }
  }
  if ((((c->running & 1U) == 0) && ((c->newsession & 1U) != 0)) && (lastc->expires == 0)) {
    freecookie(lastc);
    return (Cookie *)0x0;
  }
  lastc->livecookie = (_Bool)(c->running & 1);
  remove_expired(c);
  name._1016_8_ = c->cookies;
  ptr._7_1_ = 0;
  do {
    if (name._1016_8_ == 0) goto LAB_00971390;
    iVar2 = Curl_strcasecompare(*(char **)(name._1016_8_ + 8),lastc->name);
    if (iVar2 != 0) {
      if ((*(long *)(name._1016_8_ + 0x28) == 0) || (lastc->domain == (char *)0x0)) {
        if ((*(long *)(name._1016_8_ + 0x28) == 0) && (lastc->domain == (char *)0x0)) {
          ptr._7_1_ = 1;
        }
      }
      else {
        iVar2 = Curl_strcasecompare(*(char **)(name._1016_8_ + 0x28),lastc->domain);
        if ((iVar2 != 0) && ((*(byte *)(name._1016_8_ + 0x40) & 1) == (lastc->tailmatch & 1U))) {
          ptr._7_1_ = 1;
        }
      }
      if ((ptr._7_1_ & 1) != 0) {
        if ((*(long *)(name._1016_8_ + 0x20) == 0) || (lastc->spath == (char *)0x0)) {
          if ((*(long *)(name._1016_8_ + 0x20) == 0) && (lastc->spath == (char *)0x0)) {
            ptr._7_1_ = 1;
          }
          else {
            ptr._7_1_ = 0;
          }
        }
        else {
          iVar2 = Curl_strcasecompare(*(char **)(name._1016_8_ + 0x20),lastc->spath);
          ptr._7_1_ = iVar2 != 0;
        }
      }
      if ((((ptr._7_1_ & 1) != 0) && ((lastc->livecookie & 1U) == 0)) &&
         ((*(byte *)(name._1016_8_ + 0x59) & 1) != 0)) {
        freecookie(lastc);
        return (Cookie *)0x0;
      }
      if ((ptr._7_1_ & 1) != 0) {
        lastc->next = *(Cookie **)name._1016_8_;
        (*Curl_cfree)(*(void **)(name._1016_8_ + 8));
        (*Curl_cfree)(*(void **)(name._1016_8_ + 0x10));
        (*Curl_cfree)(*(void **)(name._1016_8_ + 0x28));
        (*Curl_cfree)(*(void **)(name._1016_8_ + 0x18));
        (*Curl_cfree)(*(void **)(name._1016_8_ + 0x20));
        (*Curl_cfree)(*(void **)(name._1016_8_ + 0x38));
        (*Curl_cfree)(*(void **)(name._1016_8_ + 0x48));
        (*Curl_cfree)(*(void **)(name._1016_8_ + 0x50));
        memcpy((void *)name._1016_8_,lastc,0x60);
        (*Curl_cfree)(lastc);
        lastc = (Cookie *)name._1016_8_;
        do {
          now._0_1_ = name[0x3f8];
          now._1_1_ = name[0x3f9];
          now._2_1_ = name[0x3fa];
          now._3_1_ = name[0x3fb];
          now._4_1_ = name[0x3fc];
          now._5_1_ = name[0x3fd];
          now._6_1_ = name[0x3fe];
          now._7_1_ = name[0x3ff];
          name._1016_8_ = *(undefined8 *)name._1016_8_;
        } while (name._1016_8_ != 0);
        name[0x3f8] = '\0';
        name[0x3f9] = '\0';
        name[0x3fa] = '\0';
        name[0x3fb] = '\0';
        name[0x3fc] = '\0';
        name[0x3fd] = '\0';
        name[0x3fe] = '\0';
        name[0x3ff] = '\0';
LAB_00971390:
        if ((c->running & 1U) != 0) {
          pcVar3 = "Added";
          if ((ptr._7_1_ & 1) != 0) {
            pcVar3 = "Replaced";
          }
          Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld\n",pcVar3,
                     lastc->name,lastc->value,lastc->domain,lastc->path,lastc->expires);
        }
        if ((ptr._7_1_ & 1) == 0) {
          if (now == 0) {
            c->cookies = lastc;
          }
          else {
            *(Cookie **)now = lastc;
          }
          c->numcookies = c->numcookies + 1;
        }
        return lastc;
      }
    }
    now._0_1_ = name[0x3f8];
    now._1_1_ = name[0x3f9];
    now._2_1_ = name[0x3fa];
    now._3_1_ = name[0x3fb];
    now._4_1_ = name[0x3fc];
    now._5_1_ = name[0x3fd];
    now._6_1_ = name[0x3fe];
    now._7_1_ = name[0x3ff];
    name._1016_8_ = *(undefined8 *)name._1016_8_;
  } while( true );
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                /* The 'data' pointer here may be NULL at times, and thus
                   must only be used very carefully for things that can deal
                   with data being NULL. Such as infof() and similar */

                struct CookieInfo *c,
                bool httpheader, /* TRUE if HTTP header-style line */
                char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path)   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
{
  struct Cookie *clist;
  char name[MAX_NAME];
  struct Cookie *co;
  struct Cookie *lastc=NULL;
  time_t now = time(NULL);
  bool replace_old = FALSE;
  bool badcookie = FALSE; /* cookies are good by default. mmmmm yummy */

#ifdef USE_LIBPSL
  const psl_ctx_t *psl;
#endif

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we're this low on memory */

  if(httpheader) {
    /* This line was read off a HTTP-header */
    const char *ptr;
    const char *semiptr;
    char *what;

    what = malloc(MAX_COOKIE_LINE);
    if(!what) {
      free(co);
      return NULL;
    }

    semiptr=strchr(lineptr, ';'); /* first, find a semicolon */

    while(*lineptr && ISBLANK(*lineptr))
      lineptr++;

    ptr = lineptr;
    do {
      /* we have a <what>=<this> pair or a stand-alone word here */
      name[0]=what[0]=0; /* init the buffers */
      if(1 <= sscanf(ptr, "%" MAX_NAME_TXT "[^;\r\n=] =%"
                     MAX_COOKIE_LINE_TXT "[^;\r\n]",
                     name, what)) {
        /* Use strstore() below to properly deal with received cookie
           headers that have the same string property set more than once,
           and then we use the last one. */
        const char *whatptr;
        bool done = FALSE;
        bool sep;
        size_t len=strlen(what);
        size_t nlen = strlen(name);
        const char *endofn = &ptr[ nlen ];

        /* name ends with a '=' ? */
        sep = (*endofn == '=')?TRUE:FALSE;

        if(nlen) {
          endofn--; /* move to the last character */
          if(ISBLANK(*endofn)) {
            /* skip trailing spaces in name */
            while(*endofn && ISBLANK(*endofn) && nlen) {
              endofn--;
              nlen--;
            }
            name[nlen]=0; /* new end of name */
          }
        }

        /* Strip off trailing whitespace from the 'what' */
        while(len && ISBLANK(what[len-1])) {
          what[len-1]=0;
          len--;
        }

        /* Skip leading whitespace from the 'what' */
        whatptr=what;
        while(*whatptr && ISBLANK(*whatptr))
          whatptr++;

        if(!co->name && sep) {
          /* The very first name/value pair is the actual cookie name */
          co->name = strdup(name);
          co->value = strdup(whatptr);
          if(!co->name || !co->value) {
            badcookie = TRUE;
            break;
          }
        }
        else if(!len) {
          /* this was a "<name>=" with no content, and we must allow
             'secure' and 'httponly' specified this weirdly */
          done = TRUE;
          if(strcasecompare("secure", name))
            co->secure = TRUE;
          else if(strcasecompare("httponly", name))
            co->httponly = TRUE;
          else if(sep)
            /* there was a '=' so we're not done parsing this field */
            done = FALSE;
        }
        if(done)
          ;
        else if(strcasecompare("path", name)) {
          strstore(&co->path, whatptr);
          if(!co->path) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
        }
        else if(strcasecompare("domain", name)) {
          bool is_ip;

          /* Now, we make sure that our host is within the given domain,
             or the given domain is not valid and thus cannot be set. */

          if('.' == whatptr[0])
            whatptr++; /* ignore preceding dot */

#ifndef USE_LIBPSL
          /*
           * Without PSL we don't know when the incoming cookie is set on a
           * TLD or otherwise "protected" suffix. To reduce risk, we require a
           * dot OR the exact host name being "localhost".
           */
          {
            const char *dotp;
            /* check for more dots */
            dotp = strchr(whatptr, '.');
            if(!dotp && !strcasecompare("localhost", whatptr))
              domain=":";
          }
#endif

          is_ip = isip(domain ? domain : whatptr);

          if(!domain
             || (is_ip && !strcmp(whatptr, domain))
             || (!is_ip && tailmatch(whatptr, domain))) {
            strstore(&co->domain, whatptr);
            if(!co->domain) {
              badcookie = TRUE;
              break;
            }
            if(!is_ip)
              co->tailmatch=TRUE; /* we always do that if the domain name was
                                     given */
          }
          else {
            /* we did not get a tailmatch and then the attempted set domain
               is not a domain to which the current host belongs. Mark as
               bad. */
            badcookie=TRUE;
            infof(data, "skipped cookie with bad tailmatch domain: %s\n",
                  whatptr);
          }
        }
        else if(strcasecompare("version", name)) {
          strstore(&co->version, whatptr);
          if(!co->version) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("max-age", name)) {
          /* Defined in RFC2109:

             Optional.  The Max-Age attribute defines the lifetime of the
             cookie, in seconds.  The delta-seconds value is a decimal non-
             negative integer.  After delta-seconds seconds elapse, the
             client should discard the cookie.  A value of zero means the
             cookie should be discarded immediately.

          */
          strstore(&co->maxage, whatptr);
          if(!co->maxage) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("expires", name)) {
          strstore(&co->expirestr, whatptr);
          if(!co->expirestr) {
            badcookie = TRUE;
            break;
          }
        }
        /*
          else this is the second (or more) name we don't know
          about! */
      }
      else {
        /* this is an "illegal" <what>=<this> pair */
      }

      if(!semiptr || !*semiptr) {
        /* we already know there are no more cookies */
        semiptr = NULL;
        continue;
      }

      ptr=semiptr+1;
      while(*ptr && ISBLANK(*ptr))
        ptr++;
      semiptr=strchr(ptr, ';'); /* now, find the next semicolon */

      if(!semiptr && *ptr)
        /* There are no more semicolons, but there's a final name=value pair
           coming up */
        semiptr=strchr(ptr, '\0');
    } while(semiptr);

    if(co->maxage) {
      co->expires =
        curlx_strtoofft((*co->maxage=='\"')?
                        &co->maxage[1]:&co->maxage[0], NULL, 10);
      if(CURL_OFF_T_MAX - now < co->expires)
        /* avoid overflow */
        co->expires = CURL_OFF_T_MAX;
      else
        co->expires += now;
    }
    else if(co->expirestr) {
      /* Note that if the date couldn't get parsed for whatever reason,
         the cookie will be treated as a session cookie */
      co->expires = curl_getdate(co->expirestr, NULL);

      /* Session cookies have expires set to 0 so if we get that back
         from the date parser let's add a second to make it a
         non-session cookie */
      if(co->expires == 0)
        co->expires = 1;
      else if(co->expires < 0)
        co->expires = 0;
    }

    if(!badcookie && !co->domain) {
      if(domain) {
        /* no domain was given in the header line, set the default */
        co->domain=strdup(domain);
        if(!co->domain)
          badcookie = TRUE;
      }
    }

    if(!badcookie && !co->path && path) {
      /* No path was given in the header line, set the default.
         Note that the passed-in path to this function MAY have a '?' and
         following part that MUST not be stored as part of the path. */
      char *queryp = strchr(path, '?');

      /* queryp is where the interesting part of the path ends, so now we
         want to the find the last */
      char *endslash;
      if(!queryp)
        endslash = strrchr(path, '/');
      else
        endslash = memrchr(path, '/', (size_t)(queryp - path));
      if(endslash) {
        size_t pathlen = (size_t)(endslash-path+1); /* include ending slash */
        co->path=malloc(pathlen+1); /* one extra for the zero byte */
        if(co->path) {
          memcpy(co->path, path, pathlen);
          co->path[pathlen]=0; /* zero terminate */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            badcookie = TRUE; /* out of memory bad */
        }
        else
          badcookie = TRUE;
      }
    }

    free(what);

    if(badcookie || !co->name) {
      /* we didn't get a cookie name or a bad one,
         this is an illegal line, bail out */
      freecookie(co);
      return NULL;
    }

  }
  else {
    /* This line is NOT a HTTP header style line, we do offer support for
       reading the odd netscape cookies-file format here */
    char *ptr;
    char *firstptr;
    char *tok_buf=NULL;
    int fields;

    /* IE introduced HTTP-only cookies to prevent XSS attacks. Cookies
       marked with httpOnly after the domain name are not accessible
       from javascripts, but since curl does not operate at javascript
       level, we include them anyway. In Firefox's cookie files, these
       lines are preceded with #HttpOnly_ and then everything is
       as usual, so we skip 10 characters of the line..
    */
    if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
      lineptr += 10;
      co->httponly = TRUE;
    }

    if(lineptr[0]=='#') {
      /* don't even try the comments */
      free(co);
      return NULL;
    }
    /* strip off the possible end-of-line characters */
    ptr=strchr(lineptr, '\r');
    if(ptr)
      *ptr=0; /* clear it */
    ptr=strchr(lineptr, '\n');
    if(ptr)
      *ptr=0; /* clear it */

    firstptr=strtok_r(lineptr, "\t", &tok_buf); /* tokenize it on the TAB */

    /* Now loop through the fields and init the struct we already have
       allocated */
    for(ptr=firstptr, fields=0; ptr && !badcookie;
        ptr=strtok_r(NULL, "\t", &tok_buf), fields++) {
      switch(fields) {
      case 0:
        if(ptr[0]=='.') /* skip preceding dots */
          ptr++;
        co->domain = strdup(ptr);
        if(!co->domain)
          badcookie = TRUE;
        break;
      case 1:
        /* This field got its explanation on the 23rd of May 2001 by
           Andr�s Garc�a:

           flag: A TRUE/FALSE value indicating if all machines within a given
           domain can access the variable. This value is set automatically by
           the browser, depending on the value you set for the domain.

           As far as I can see, it is set to true when the cookie says
           .domain.com and to false when the domain is complete www.domain.com
        */
        co->tailmatch = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 2:
        /* It turns out, that sometimes the file format allows the path
           field to remain not filled in, we try to detect this and work
           around it! Andr�s Garc�a made us aware of this... */
        if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
          /* only if the path doesn't look like a boolean option! */
          co->path = strdup(ptr);
          if(!co->path)
            badcookie = TRUE;
          else {
            co->spath = sanitize_cookie_path(co->path);
            if(!co->spath) {
              badcookie = TRUE; /* out of memory bad */
            }
          }
          break;
        }
        /* this doesn't look like a path, make one up! */
        co->path = strdup("/");
        if(!co->path)
          badcookie = TRUE;
        co->spath = strdup("/");
        if(!co->spath)
          badcookie = TRUE;
        fields++; /* add a field and fall down to secure */
        /* FALLTHROUGH */
      case 3:
        co->secure = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 4:
        co->expires = curlx_strtoofft(ptr, NULL, 10);
        break;
      case 5:
        co->name = strdup(ptr);
        if(!co->name)
          badcookie = TRUE;
        break;
      case 6:
        co->value = strdup(ptr);
        if(!co->value)
          badcookie = TRUE;
        break;
      }
    }
    if(6 == fields) {
      /* we got a cookie with blank contents, fix it */
      co->value = strdup("");
      if(!co->value)
        badcookie = TRUE;
      else
        fields++;
    }

    if(!badcookie && (7 != fields))
      /* we did not find the sufficient number of fields */
      badcookie = TRUE;

    if(badcookie) {
      freecookie(co);
      return NULL;
    }

  }

  if(!c->running &&    /* read from a file */
     c->newsession &&  /* clean session cookies */
     !co->expires) {   /* this is a session cookie since it doesn't expire! */
    freecookie(co);
    return NULL;
  }

  co->livecookie = c->running;

  /* now, we have parsed the incoming line, we must now check if this
     superceeds an already existing cookie, which it may if the previous have
     the same domain and path as this */

  /* at first, remove expired cookies */
  remove_expired(c);

#ifdef USE_LIBPSL
  /* Check if the domain is a Public Suffix and if yes, ignore the cookie.
     This needs a libpsl compiled with builtin data. */
  if(domain && co->domain && !isip(co->domain)) {
    psl = psl_builtin();
    if(psl && !psl_is_cookie_domain_acceptable(psl, domain, co->domain)) {
      infof(data,
            "cookie '%s' dropped, domain '%s' must not set cookies for '%s'\n",
            co->name, domain, co->domain);
      freecookie(co);
      return NULL;
    }
  }
#endif

  clist = c->cookies;
  replace_old = FALSE;
  while(clist) {
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old=TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath) {
          if(strcasecompare(clist->spath, co->spath)) {
            replace_old = TRUE;
          }
          else
            replace_old = FALSE;
        }
        else if(!clist->spath && !co->spath)
          replace_old = TRUE;
        else
          replace_old = FALSE;

      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /* Both cookies matched fine, except that the already present
           cookie is "live", which means it was set from a header, while
           the new one isn't "live" and thus only read from a file. We let
           live cookies stay alive */

        /* Free the newcomer and get out of here! */
        freecookie(co);
        return NULL;
      }

      if(replace_old) {
        co->next = clist->next; /* get the next-pointer first */

        /* then free all the old pointers */
        free(clist->name);
        free(clist->value);
        free(clist->domain);
        free(clist->path);
        free(clist->spath);
        free(clist->expirestr);
        free(clist->version);
        free(clist->maxage);

        *clist = *co;  /* then store all the new data */

        free(co);   /* free the newly alloced memory */
        co = clist; /* point to the previous struct instead */

        /* We have replaced a cookie, now skip the rest of the list but
           make sure the 'lastc' pointer is properly set */
        do {
          lastc = clist;
          clist = clist->next;
        } while(clist);
        break;
      }
    }
    lastc = clist;
    clist = clist->next;
  }

  if(c->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" CURL_FORMAT_CURL_OFF_T "\n",
          replace_old?"Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replace_old) {
    /* then make the last item point on this new one */
    if(lastc)
      lastc->next = co;
    else
      c->cookies = co;
    c->numcookies++; /* one more cookie in the jar */
  }

  return co;
}